

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus.c
# Opt level: O0

void qemu_tcg_init_vcpu(CPUState *cpu)

{
  CPUState *cpu_local;
  
  tcg_region_init_tricore((TCGContext_conflict9 *)cpu->uc->tcg_ctx);
  cpu->created = true;
  return;
}

Assistant:

static void qemu_tcg_init_vcpu(CPUState *cpu)
{
    /*
     * Initialize TCG regions--once. Now is a good time, because:
     * (1) TCG's init context, prologue and target globals have been set up.
     * (2) qemu_tcg_mttcg_enabled() works now (TCG init code runs before the
     *     -accel flag is processed, so the check doesn't work then).
     */
    tcg_region_init(cpu->uc->tcg_ctx);

    cpu->created = true;
}